

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O3

bool djgt__glTexSubImage2D(djg_texture *texture,GLenum target,GLint xoffset,GLint yoffset)

{
  int iVar1;
  GLenum GVar2;
  GLenum GVar3;
  uint uVar4;
  djgt__glpss backup;
  GLint local_58 [12];
  
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[7] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[8] = 2;
  djgt__get_glpus(backup);
  iVar1 = bcmp(local_58,backup,0x24);
  if (iVar1 != 0) {
    djgt__set_glpus(local_58);
  }
  uVar4 = texture->comp - 1;
  GVar3 = 0x500;
  GVar2 = 0x500;
  if (uVar4 < 4) {
    GVar2 = *(GLenum *)(&DAT_0019b380 + (ulong)uVar4 * 4);
  }
  uVar4 = texture->pf - 1;
  if (uVar4 < 4) {
    GVar3 = *(GLenum *)(&DAT_0019b390 + (ulong)uVar4 * 4);
  }
  (*glad_glTexSubImage2D)(target,0,0,xoffset,texture->x,texture->y,GVar2,GVar3,texture->texels);
  if (iVar1 != 0) {
    djgt__set_glpus(backup);
  }
  GVar2 = (*glad_glGetError)();
  do {
    GVar3 = (*glad_glGetError)();
  } while (GVar3 != 0);
  return GVar2 == 0;
}

Assistant:

static bool
djgt__glTexSubImage2D(
    const djg_texture *texture,
    GLenum target,
    GLint xoffset,
    GLint yoffset
) {
    djgt__glpss pus = {0, 0, 0, 0, 0, 0 ,0, 0, 2};
    djgt__glpss backup;
    bool reset;

    djgt__get_glpus(backup);
    reset = memcmp(pus, backup, sizeof(djgt__glpss)) != 0;
    if (reset) djgt__set_glpus(pus);
    glTexSubImage2D(target,
           /*level*/0,
                    xoffset,
                    yoffset,
                    texture->x,
                    texture->y,
                    djgt__glformat(texture->comp),
                    djgt__gltype(texture->pf),
                    texture->texels);
    if (reset) djgt__set_glpus(backup);

    return djgt__validate();
}